

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void datetimeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  byte *z;
  char zBuf [24];
  DateTime x;
  byte local_58;
  byte local_57;
  byte local_56;
  byte local_55;
  byte local_54;
  undefined1 local_53;
  char local_52;
  char local_51;
  undefined1 local_50;
  char local_4f;
  char local_4e;
  undefined1 local_4d;
  char local_4c;
  char local_4b;
  undefined1 local_4a;
  char local_49;
  char local_48;
  undefined1 local_47;
  char local_46;
  char local_45;
  undefined1 local_44;
  DateTime local_40;
  
  z = &local_58;
  iVar3 = isDate(context,argc,argv,&local_40);
  if (iVar3 == 0) {
    computeYMD(&local_40);
    computeHMS(&local_40);
    uVar1 = -local_40.Y;
    if (0 < local_40.Y) {
      uVar1 = local_40.Y;
    }
    uVar4 = (ulong)uVar1;
    local_57 = (char)(uVar1 / 1000) + (char)((uVar4 / 1000) * 0x1999999a >> 0x20) * -10 | 0x30;
    local_56 = (char)(uVar1 / 100) + (char)((uVar4 / 100) * 0x1999999a >> 0x20) * -10 | 0x30;
    cVar2 = (char)(uVar1 / 10);
    local_55 = cVar2 + (char)((uVar4 / 10) * 0x1999999a >> 0x20) * -10 | 0x30;
    local_54 = (char)uVar1 + (cVar2 + (char)(uVar1 / 10)) * -5 | 0x30;
    local_53 = 0x2d;
    cVar2 = (char)(local_40.M / 10);
    local_52 = cVar2 + (char)((local_40.M / 10) / 10) * -10 + '0';
    local_51 = (char)local_40.M + cVar2 * -10 + '0';
    local_50 = 0x2d;
    cVar2 = (char)(local_40.D / 10);
    local_4f = cVar2 + (char)((local_40.D / 10) / 10) * -10 + '0';
    local_4e = (char)local_40.D + cVar2 * -10 + '0';
    local_4d = 0x20;
    cVar2 = (char)(local_40.h / 10);
    local_4c = cVar2 + (char)((local_40.h / 10) / 10) * -10 + '0';
    local_4b = (char)local_40.h + cVar2 * -10 + '0';
    local_4a = 0x3a;
    cVar2 = (char)(local_40.m / 10);
    local_49 = cVar2 + (char)((local_40.m / 10) / 10) * -10 + '0';
    local_48 = (char)local_40.m + cVar2 * -10 + '0';
    iVar3 = (int)local_40.s / 10;
    cVar2 = (char)iVar3;
    local_46 = cVar2 + (char)(iVar3 / 10) * -10 + '0';
    local_45 = (char)(int)local_40.s + cVar2 * -10 + '0';
    local_47 = 0x3a;
    local_44 = 0;
    if (local_40.Y < 0) {
      local_58 = 0x2d;
      iVar3 = 0x14;
    }
    else {
      z = &local_57;
      iVar3 = 0x13;
    }
    setResultStrOrError(context,(char *)z,iVar3,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  }
  return;
}

Assistant:

static void datetimeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    int Y, s;
    char zBuf[24];
    computeYMD_HMS(&x);
    Y = x.Y;
    if( Y<0 ) Y = -Y;
    zBuf[1] = '0' + (Y/1000)%10;
    zBuf[2] = '0' + (Y/100)%10;
    zBuf[3] = '0' + (Y/10)%10;
    zBuf[4] = '0' + (Y)%10;
    zBuf[5] = '-';
    zBuf[6] = '0' + (x.M/10)%10;
    zBuf[7] = '0' + (x.M)%10;
    zBuf[8] = '-';
    zBuf[9] = '0' + (x.D/10)%10;
    zBuf[10] = '0' + (x.D)%10;
    zBuf[11] = ' ';
    zBuf[12] = '0' + (x.h/10)%10;
    zBuf[13] = '0' + (x.h)%10;
    zBuf[14] = ':';
    zBuf[15] = '0' + (x.m/10)%10;
    zBuf[16] = '0' + (x.m)%10;
    zBuf[17] = ':';
    s = (int)x.s;
    zBuf[18] = '0' + (s/10)%10;
    zBuf[19] = '0' + (s)%10;
    zBuf[20] = 0;
    if( x.Y<0 ){
      zBuf[0] = '-';
      sqlite3_result_text(context, zBuf, 20, SQLITE_TRANSIENT);
    }else{
      sqlite3_result_text(context, &zBuf[1], 19, SQLITE_TRANSIENT);
    }
  }
}